

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_JUnitOutputTest_MultipleTestCaseWithTestLocations_TestShell::createTest
          (TEST_JUnitOutputTest_MultipleTestCaseWithTestLocations_TestShell *this)

{
  TEST_JUnitOutputTest_MultipleTestCaseWithTestLocations_Test *this_00;
  
  this_00 = (TEST_JUnitOutputTest_MultipleTestCaseWithTestLocations_Test *)
            operator_new(0x28,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/JUnitOutputTest.cpp"
                         ,0x2a8);
  TEST_JUnitOutputTest_MultipleTestCaseWithTestLocations_Test::
  TEST_JUnitOutputTest_MultipleTestCaseWithTestLocations_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(JUnitOutputTest, MultipleTestCaseWithTestLocations)
{
    testCaseRunner->start()
            .withGroup("twoTestsGroup")
            .withTest("firstTestName").inFile("MyFirstSource.c").onLine(846)
            .withTest("secondTestName").inFile("MySecondSource.c").onLine(513)
            .end();

    outputFile = fileSystem.file("cpputest_twoTestsGroup.xml");

    STRCMP_EQUAL("<testcase classname=\"twoTestsGroup\" name=\"firstTestName\" assertions=\"0\" time=\"0.000\" file=\"MyFirstSource.c\" line=\"846\">\n", outputFile->line(5));
    STRCMP_EQUAL("<testcase classname=\"twoTestsGroup\" name=\"secondTestName\" assertions=\"0\" time=\"0.000\" file=\"MySecondSource.c\" line=\"513\">\n", outputFile->line(7));
}